

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_default_catalog.cpp
# Opt level: O1

void ConcurrentDefaultCatalog::QueryDefaultCatalogFunctions
               (DuckDB *db,bool *read_correct,int thread_id)

{
  char cVar1;
  int iVar2;
  pointer *__ptr;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  random_queries;
  Connection con;
  _Head_base<0UL,_duckdb::MaterializedQueryResult_*,_false> local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  undefined1 *local_2c8 [2];
  undefined1 local_2b8 [16];
  undefined1 *local_2a8 [2];
  undefined1 local_298 [16];
  undefined1 *local_288 [2];
  undefined1 local_278 [16];
  undefined1 *local_268 [2];
  undefined1 local_258 [16];
  undefined1 *local_248 [2];
  undefined1 local_238 [16];
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,"SELECT pg_collation_is_visible(0)","");
  local_2c8[0] = local_2b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2c8,"SELECT pg_conversion_is_visible(0)","");
  local_2a8[0] = local_298;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2a8,"SELECT pg_function_is_visible(0)","");
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_288,"SELECT pg_opclass_is_visible(0)","");
  local_268[0] = local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_268,"SELECT pg_operator_is_visible(0)","");
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_248,"SELECT pg_opfamily_is_visible(0)","");
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"SELECT pg_table_is_visible(0)","");
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_208,"SELECT pg_ts_config_is_visible(0)","");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1e8,"SELECT pg_ts_dict_is_visible(0)","");
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c8,"SELECT pg_ts_parser_is_visible(0)","");
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"SELECT pg_ts_template_is_visible(0)","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,"SELECT pg_type_is_visible(0)","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"SELECT current_user","");
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"SELECT current_catalog","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_128,"SELECT current_database()","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"SELECT user","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"SELECT session_user","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"SELECT inet_client_addr()","")
  ;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"SELECT inet_client_port()","")
  ;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"SELECT inet_server_addr()","")
  ;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"SELECT inet_server_port()","")
  ;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"SELECT pg_my_temp_schema()","");
  __l._M_len = 0x16;
  __l._M_array = &local_2e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_300,__l,(allocator_type *)&local_308);
  lVar3 = 0;
  do {
    if (local_38 + lVar3 != *(undefined1 **)((long)local_48 + lVar3)) {
      operator_delete(*(undefined1 **)((long)local_48 + lVar3));
    }
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x2c0);
  duckdb::Connection::Connection((Connection *)&local_2e8,db);
  *read_correct = true;
  lVar3 = 10;
  do {
    iVar2 = rand();
    duckdb::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&local_300,
               (ulong)(long)iVar2 %
               (ulong)((long)local_300.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_300.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5));
    duckdb::Connection::Query((string *)&local_308);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_308);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (cVar1 != '\0') {
      *read_correct = false;
    }
    if (local_308._M_head_impl != (MaterializedQueryResult *)0x0) {
      (**(code **)(*(long *)local_308._M_head_impl + 8))();
    }
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  duckdb::Connection::~Connection((Connection *)&local_2e8);
  Catch::clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_300);
  return;
}

Assistant:

static void QueryDefaultCatalogFunctions(DuckDB *db, bool *read_correct, int thread_id) {
		duckdb::vector<string> random_queries {
		    "SELECT pg_collation_is_visible(0)",
		    "SELECT pg_conversion_is_visible(0)",
		    "SELECT pg_function_is_visible(0)",
		    "SELECT pg_opclass_is_visible(0)",
		    "SELECT pg_operator_is_visible(0)",
		    "SELECT pg_opfamily_is_visible(0)",
		    "SELECT pg_table_is_visible(0)",
		    "SELECT pg_ts_config_is_visible(0)",
		    "SELECT pg_ts_dict_is_visible(0)",
		    "SELECT pg_ts_parser_is_visible(0)",
		    "SELECT pg_ts_template_is_visible(0)",
		    "SELECT pg_type_is_visible(0)",
		    "SELECT current_user",
		    "SELECT current_catalog",
		    "SELECT current_database()",
		    "SELECT user",
		    "SELECT session_user",
		    "SELECT inet_client_addr()",
		    "SELECT inet_client_port()",
		    "SELECT inet_server_addr()",
		    "SELECT inet_server_port()",
		    "SELECT pg_my_temp_schema()",
		};

		Connection con(*db);
		*read_correct = true;
		for (idx_t i = 0; i < CONCURRENT_DEFAULT_ITERATION_COUNT; i++) {
			auto result = con.Query(random_queries[rand() % random_queries.size()]);
			if (result->HasError()) {
				*read_correct = false;
			}
		}
	}